

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void expandFormatArguments<Token>(vector<String,_std::allocator<String>_> *data,Token *arg)

{
  String *__x;
  FormatArgument local_38;
  Token *local_18;
  Token *arg_local;
  vector<String,_std::allocator<String>_> *data_local;
  
  local_18 = arg;
  arg_local = (Token *)data;
  FormatArgument::FormatArgument<Token>(&local_38,arg);
  __x = FormatArgument::text(&local_38);
  std::vector<String,_std::allocator<String>_>::push_back(data,__x);
  FormatArgument::~FormatArgument(&local_38);
  expandFormatArguments((vector<String,_std::allocator<String>_> *)arg_local);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}